

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O2

void __thiscall validation_tests::block_malleation::test_method(block_malleation *this)

{
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *pvVar1;
  long lVar2;
  element_type *peVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint256 commitment;
  uint256 commitment_00;
  bool bVar8;
  readonly_property<bool> rVar9;
  readonly_property65 rVar10;
  size_t sVar11;
  bool check_witness_root;
  bool check_witness_root_00;
  bool check_witness_root_01;
  bool check_witness_root_02;
  bool check_witness_root_03;
  bool check_witness_root_04;
  bool check_witness_root_05;
  bool check_witness_root_06;
  bool check_witness_root_07;
  CBlock *pCVar12;
  iterator in_R8;
  iterator pvVar13;
  iterator in_R9;
  iterator pvVar14;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  check_type cVar15;
  check_type cVar16;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  assertion_result local_530;
  char **local_518;
  assertion_result local_510;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  anon_class_8_1_4b23ed87 is_not_mutated;
  anon_class_1_0_00000001 local_1f9;
  undefined1 local_1f8 [16];
  shared_count asStack_1e8 [2];
  uint256 merkle_root;
  CMutableTransaction tx3;
  HashWriter hasher_1;
  HashWriter hasher;
  CBlock block;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  is_not_mutated.is_mutated = &local_1f9;
  CBlock::CBlock(&block);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xd0;
  file.m_begin = (iterator)&local_218;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_228,msg);
  hasher_1.ctx.s[2] = 0;
  hasher_1.ctx.s[3] = 0;
  hasher_1.ctx.s[4] = 0;
  hasher_1.ctx.s[5] = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_1568565;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc8ba80;
  hasher.ctx.s[2]._0_1_ = 0;
  hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_230 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  hasher.ctx.s._24_8_ = &tx3;
  hasher_1.ctx.s[0]._0_1_ =
       block.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       block.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar15,
             (size_t)&local_238,0xd0);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xd2;
  file_00.m_begin = (iterator)&local_248;
  msg_00.m_end = pvVar14;
  msg_00.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_258,
             msg_00);
  hasher_1.ctx.s[0]._0_1_ =
       test_method::anon_class_1_0_00000001::operator()
                 ((anon_class_1_0_00000001 *)&block,(CBlock *)0x0,check_witness_root);
  hasher_1.ctx.s[2] = 0;
  hasher_1.ctx.s[3] = 0;
  hasher_1.ctx.s[4] = 0;
  hasher_1.ctx.s[5] = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_156857e;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc8ba99;
  hasher.ctx.s[2]._0_1_ = 0;
  hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_260 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  hasher.ctx.s._24_8_ = &tx3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar15,
             (size_t)&local_268,0xd2);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xd4;
  file_01.m_begin = (iterator)&local_278;
  msg_01.m_end = pvVar14;
  msg_01.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_288,
             msg_01);
  hasher_1.ctx.s[0]._0_1_ =
       test_method::anon_class_8_1_4b23ed87::operator()(&is_not_mutated,&block,false);
  hasher_1.ctx.s[2] = 0;
  hasher_1.ctx.s[3] = 0;
  hasher_1.ctx.s[4] = 0;
  hasher_1.ctx.s[5] = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_1568597;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc8bab6;
  hasher.ctx.s[2]._0_1_ = 0;
  hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_290 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  hasher.ctx.s._24_8_ = &tx3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar15,
             (size_t)&local_298,0xd4);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
  test_method::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&hasher,false);
  pvVar1 = &block.vtx;
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)pvVar1,(shared_ptr<const_CTransaction> *)&hasher);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(hasher.ctx.s + 2));
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xd9;
  file_02.m_begin = (iterator)&local_2a8;
  msg_02.m_end = pvVar14;
  msg_02.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b8,
             msg_02);
  hasher_1.ctx.s[0]._0_1_ =
       transaction_identifier<false>::operator!=
                 (&(((block.vtx.
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   hash,&block.super_CBlockHeader.hashMerkleRoot);
  hasher_1.ctx.s[2] = 0;
  hasher_1.ctx.s[3] = 0;
  hasher_1.ctx.s[4] = 0;
  hasher_1.ctx.s[5] = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_15685b0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc8bae6;
  hasher.ctx.s[2]._0_1_ = 0;
  hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_2c0 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  hasher.ctx.s._24_8_ = &tx3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar15,
             (size_t)&local_2c8,0xd9);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xda;
  file_03.m_begin = (iterator)&local_2d8;
  msg_03.m_end = pvVar14;
  msg_03.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2e8,
             msg_03);
  hasher_1.ctx.s[0]._0_1_ =
       test_method::anon_class_1_0_00000001::operator()
                 ((anon_class_1_0_00000001 *)&block,(CBlock *)0x0,check_witness_root_00);
  hasher_1.ctx.s[2] = 0;
  hasher_1.ctx.s[3] = 0;
  hasher_1.ctx.s[4] = 0;
  hasher_1.ctx.s[5] = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_156857e;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc8ba99;
  hasher.ctx.s[2]._0_1_ = 0;
  hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_2f0 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  hasher.ctx.s._24_8_ = &tx3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar15,
             (size_t)&local_2f8,0xda);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
  peVar3 = ((block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar5 = *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar6 = *(undefined8 *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar7 = *(undefined8 *)
           ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)uVar7
  ;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._17_7_ =
       SUB87((ulong)uVar7 >> 8,0);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = (uchar)uVar5;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._1_7_ =
       SUB87((ulong)uVar5 >> 8,0);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = (uchar)uVar6;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._9_7_ =
       SUB87((ulong)uVar6 >> 8,0);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xdc;
  file_04.m_begin = (iterator)&local_308;
  msg_04.m_end = pvVar14;
  msg_04.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_318,
             msg_04);
  hasher_1.ctx.s[0]._0_1_ =
       test_method::anon_class_8_1_4b23ed87::operator()(&is_not_mutated,&block,false);
  hasher_1.ctx.s[2] = 0;
  hasher_1.ctx.s[3] = 0;
  hasher_1.ctx.s[4] = 0;
  hasher_1.ctx.s[5] = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_1568597;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc8bab6;
  hasher.ctx.s[2]._0_1_ = 0;
  hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_320 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  hasher.ctx.s._24_8_ = &tx3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar15,
             (size_t)&local_328,0xdc);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&hasher);
  std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)&hasher_1);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)pvVar1,(shared_ptr<const_CTransaction> *)&hasher_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(hasher_1.ctx.s + 2));
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&hasher);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xe2;
  file_05.m_begin = (iterator)&local_338;
  msg_05.m_end = pvVar14;
  msg_05.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_348,
             msg_05);
  hasher_1.ctx.s[0]._0_1_ =
       test_method::anon_class_1_0_00000001::operator()
                 ((anon_class_1_0_00000001 *)&block,(CBlock *)0x0,check_witness_root_01);
  hasher_1.ctx.s[2] = 0;
  hasher_1.ctx.s[3] = 0;
  hasher_1.ctx.s[4] = 0;
  hasher_1.ctx.s[5] = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_156857e;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc8ba99;
  hasher.ctx.s[2]._0_1_ = '\0';
  hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_350 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  hasher.ctx.s._24_8_ = &tx3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar15,
             (size_t)&local_358,0xe2);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
  CSHA256::CSHA256(&hasher.ctx);
  CSHA256::Write(&hasher.ctx,
                 (uchar *)&(((block.vtx.
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->hash,0x20);
  CSHA256::Write(&hasher.ctx,
                 (uchar *)&(block.vtx.
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash,0x20);
  HashWriter::GetHash((uint256 *)&hasher_1,&hasher);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
       (uchar)hasher_1.ctx.s[4];
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._17_7_ =
       hasher_1.ctx.s._17_7_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
       hasher_1.ctx.s._24_8_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] =
       (uchar)hasher_1.ctx.s[0];
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._1_7_ =
       hasher_1.ctx.s._1_7_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] =
       (uchar)hasher_1.ctx.s[2];
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._9_7_ =
       hasher_1.ctx.s._9_7_;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xe7;
  file_06.m_begin = (iterator)&local_368;
  msg_06.m_end = pvVar14;
  msg_06.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_378,
             msg_06);
  bVar8 = test_method::anon_class_8_1_4b23ed87::operator()(&is_not_mutated,&block,false);
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar8);
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hasher_1.ctx.s._24_8_ = &merkle_root;
  merkle_root.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1568597;
  merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"is_not_mutated(block, false)" + 0x1c;
  hasher_1.ctx.s._8_8_ = hasher_1.ctx.s._8_8_ & 0xffffffffffffff00;
  hasher_1.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher_1.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_380 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx3,(lazy_ostream *)&hasher_1,1,0,WARN,_cVar15,(size_t)&local_388,
             0xe7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&block.vtx.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             &(block.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  CSHA256::CSHA256(&hasher_1.ctx);
  CSHA256::Write(&hasher_1.ctx,
                 (uchar *)&(((block.vtx.
                              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->hash,0x20);
  CSHA256::Write(&hasher_1.ctx,
                 (uchar *)&(block.vtx.
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->hash,0x20);
  HashWriter::GetHash((uint256 *)&tx3,&hasher_1);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
       (uchar)tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._17_7_ =
       SUB87((ulong)tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage >> 8,0);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
       tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
       _M_start;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] =
       (uchar)tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._1_7_ =
       SUB87((ulong)tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start >> 8,0);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] =
       (uchar)tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._9_7_ =
       SUB87((ulong)tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish >> 8,0);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xf0;
  file_07.m_begin = (iterator)&local_398;
  msg_07.m_end = pvVar14;
  msg_07.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3a8,
             msg_07);
  bVar8 = test_method::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&block,(CBlock *)0x0,check_witness_root_02);
  merkle_root.super_base_blob<256U>.m_data._M_elems[0] = bVar8;
  merkle_root.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f8;
  local_1f8._0_8_ = "is_mutated(block, false)";
  local_1f8._8_8_ = "";
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_3b0 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&merkle_root,(lazy_ostream *)&tx3,1,0,WARN,_cVar15,
             (size_t)&local_3b8,0xf0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(merkle_root.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear(pvVar1);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&hasher_1);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hasher_1,1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(hasher_1.ctx.s + 6),1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(hasher_1.ctx.s._24_8_ + 8),4);
  std::make_shared<CTransaction_const,CMutableTransaction&>(&tx3);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)pvVar1,(shared_ptr<const_CTransaction> *)&tx3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  peVar3 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar5 = *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar6 = *(undefined8 *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar7 = *(undefined8 *)
           ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)uVar7
  ;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._17_7_ =
       SUB87((ulong)uVar7 >> 8,0);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = (uchar)uVar5;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._1_7_ =
       SUB87((ulong)uVar5 >> 8,0);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = (uchar)uVar6;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._9_7_ =
       SUB87((ulong)uVar6 >> 8,0);
  bVar8 = CTransaction::IsCoinBase
                    (block.vtx.
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (!bVar8) {
    __assert_fail("block.vtx.back()->IsCoinBase()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
                  ,0xfc,"void validation_tests::block_malleation::test_method()");
  }
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(block.vtx.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&::TX_NO_WITNESS;
  sVar11 = GetSerializeSize<ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>>>
                     ((ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)
                      &tx3);
  if (sVar11 != 0x40) {
    __assert_fail("GetSerializeSize(TX_NO_WITNESS(block.vtx.back())) == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
                  ,0xfd,"void validation_tests::block_malleation::test_method()");
  }
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&hasher_1);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xff;
  file_08.m_begin = (iterator)&local_3c8;
  msg_08.m_end = pvVar14;
  msg_08.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3d8,
             msg_08);
  bVar8 = test_method::anon_class_8_1_4b23ed87::operator()(&is_not_mutated,&block,false);
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar8);
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  merkle_root.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1568597;
  merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"is_not_mutated(block, false)" + 0x1c;
  hasher_1.ctx.s._8_8_ = hasher_1.ctx.s._8_8_ & 0xffffffffffffff00;
  hasher_1.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher_1.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_3e0 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  hasher_1.ctx.s._24_8_ = (assertion_result *)&merkle_root;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx3,(lazy_ostream *)&hasher_1,1,0,WARN,_cVar15,(size_t)&local_3e8,
             0xff);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(pvVar1);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&hasher);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x116;
  file_09.m_begin = (iterator)&local_3f8;
  msg_09.m_end = pvVar14;
  msg_09.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_408,
             msg_09);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&block,"ff204bd0000000000000",(allocator<char> *)local_1f8);
  bVar8 = DecodeHexTx((CMutableTransaction *)&hasher,(string *)&block,true,false);
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar8);
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  merkle_root.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_156862e;
  merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"DecodeHexTx(tx1, \"ff204bd0000000000000\", true, false)" + 0x35;
  hasher_1.ctx.s._8_8_ = hasher_1.ctx.s._8_8_ & 0xffffffffffffff00;
  hasher_1.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
  hasher_1.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_410 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  hasher_1.ctx.s._24_8_ = (assertion_result *)&merkle_root;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx3,(lazy_ostream *)&hasher_1,1,0,WARN,_cVar15,(size_t)&local_418,
             0x116);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&block);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&hasher_1);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x118;
  file_10.m_begin = (iterator)&local_428;
  msg_10.m_end = pvVar14;
  msg_10.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_438,
             msg_10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&block,"8ae53c92000000000000",(allocator<char> *)&local_530);
  bVar8 = DecodeHexTx((CMutableTransaction *)&hasher_1,(string *)&block,true,false);
  merkle_root.super_base_blob<256U>.m_data._M_elems[0] = bVar8;
  merkle_root.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  merkle_root.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1f8._0_8_ = "DecodeHexTx(tx2, \"8ae53c92000000000000\", true, false)";
  local_1f8._8_8_ = "";
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_440 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&merkle_root,(lazy_ostream *)&tx3,1,0,WARN,_cVar15,
             (size_t)&local_448,0x118);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(merkle_root.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__cxx11::string::~string((string *)&block);
  CMutableTransaction::CMutableTransaction(&tx3);
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x11a;
  file_11.m_begin = (iterator)&local_458;
  msg_11.m_end = pvVar14;
  msg_11.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_468,
             msg_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&block,
             "cdaf22d00002c6a7f848f8ae4d30054e61dcf3303d6fe01d282163341f06feecc10032b3160fcab87bdfe3ecfb769206ef2d991b92f8a268e423a6ef4d485f06"
             ,(allocator<char> *)&local_510);
  rVar9.super_class_property<bool>.value =
       (class_property<bool>)DecodeHexTx(&tx3,(string *)&block,true,false);
  local_1f8._8_8_ = (char *)0x0;
  asStack_1e8[0].pi_ = (sp_counted_base *)0x0;
  local_530._0_8_ =
       "DecodeHexTx(tx3, \"cdaf22d00002c6a7f848f8ae4d30054e61dcf3303d6fe01d282163341f06feecc10032b3160fcab87bdfe3ecfb769206ef2d991b92f8a268e423a6ef4d485f06\", true, false)"
  ;
  local_530.m_message.px = (element_type *)0xc8bd0e;
  merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_ =
       merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  merkle_root.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011481f0;
  merkle_root.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_470 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  merkle_root.super_base_blob<256U>.m_data._M_elems._24_8_ = (allocator<char> *)&local_530;
  local_1f8[0] = rVar9.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&merkle_root,1,0,WARN,_cVar15,
             (size_t)&local_478,0x11a);
  boost::detail::shared_count::~shared_count(asStack_1e8);
  std::__cxx11::string::~string((string *)&block);
  CSHA256::CSHA256((CSHA256 *)&block);
  CMutableTransaction::GetHash((Txid *)&merkle_root,(CMutableTransaction *)&hasher);
  CSHA256::Write((CSHA256 *)&block,(uchar *)&merkle_root,0x20);
  CMutableTransaction::GetHash((Txid *)&merkle_root,(CMutableTransaction *)&hasher_1);
  CSHA256::Write((CSHA256 *)&block,(uchar *)&merkle_root,0x20);
  HashWriter::GetHash(&merkle_root,(HashWriter *)&block);
  CMutableTransaction::GetHash((Txid *)local_1f8,&tx3);
  bVar8 = ::operator==(&merkle_root.super_base_blob<256U>,(base_blob<256U> *)local_1f8);
  if (!bVar8) {
    __assert_fail("hasher.GetHash() == tx3.GetHash()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
                  ,0x120,"void validation_tests::block_malleation::test_method()");
  }
  merkle_root.super_base_blob<256U>.m_data._M_elems._0_8_ = &::TX_NO_WITNESS;
  merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_ = &tx3;
  sVar11 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CMutableTransaction>>
                     ((ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)&merkle_root);
  if (sVar11 == 0x40) {
    CBlock::CBlock(&block);
    pvVar1 = &block.vtx;
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&merkle_root);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)pvVar1,(shared_ptr<const_CTransaction> *)&merkle_root);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (merkle_root.super_base_blob<256U>.m_data._M_elems + 8));
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&merkle_root);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)pvVar1,(shared_ptr<const_CTransaction> *)&merkle_root);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (merkle_root.super_base_blob<256U>.m_data._M_elems + 8));
    BlockMerkleRoot((uint256 *)local_1f8,&block,(bool *)0x0);
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
         (uchar)asStack_1e8[0].pi_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._17_7_ =
         SUB87((ulong)asStack_1e8[0].pi_ >> 8,0);
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
         asStack_1e8[1].pi_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] =
         (uchar)local_1f8[0];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = local_1f8[1];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = local_1f8[2];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = local_1f8[3];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = local_1f8[4];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = local_1f8[5];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = local_1f8[6];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = local_1f8[7];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] =
         (uchar)local_1f8._8_8_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._9_7_ =
         SUB87(local_1f8._8_8_,1);
    merkle_root.super_base_blob<256U>.m_data._M_elems[0] = (uchar)local_1f8[0];
    merkle_root.super_base_blob<256U>.m_data._M_elems[1] = local_1f8[1];
    merkle_root.super_base_blob<256U>.m_data._M_elems[2] = local_1f8[2];
    merkle_root.super_base_blob<256U>.m_data._M_elems[3] = local_1f8[3];
    merkle_root.super_base_blob<256U>.m_data._M_elems[4] = local_1f8[4];
    merkle_root.super_base_blob<256U>.m_data._M_elems[5] = local_1f8[5];
    merkle_root.super_base_blob<256U>.m_data._M_elems[6] = local_1f8[6];
    merkle_root.super_base_blob<256U>.m_data._M_elems[7] = local_1f8[7];
    merkle_root.super_base_blob<256U>.m_data._M_elems[8] = local_1f8[8];
    merkle_root.super_base_blob<256U>.m_data._M_elems[9] = local_1f8[9];
    merkle_root.super_base_blob<256U>.m_data._M_elems[10] = local_1f8[10];
    merkle_root.super_base_blob<256U>.m_data._M_elems[0xb] = local_1f8[0xb];
    merkle_root.super_base_blob<256U>.m_data._M_elems[0xc] = local_1f8[0xc];
    merkle_root.super_base_blob<256U>.m_data._M_elems[0xd] = local_1f8[0xd];
    merkle_root.super_base_blob<256U>.m_data._M_elems[0xe] = local_1f8[0xe];
    merkle_root.super_base_blob<256U>.m_data._M_elems[0xf] = local_1f8[0xf];
    merkle_root.super_base_blob<256U>.m_data._M_elems._16_8_ = asStack_1e8[0].pi_;
    merkle_root.super_base_blob<256U>.m_data._M_elems._24_8_ = asStack_1e8[1].pi_;
    local_488 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_480 = "";
    local_498 = &boost::unit_test::basic_cstring<char_const>::null;
    local_490 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x129;
    file_12.m_begin = (iterator)&local_488;
    msg_12.m_end = pvVar14;
    msg_12.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_498,
               msg_12);
    rVar9.super_class_property<bool>.value =
         (class_property<bool>)
         test_method::anon_class_8_1_4b23ed87::operator()(&is_not_mutated,&block,false);
    local_530.m_message.px = (element_type *)0x0;
    local_530.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_510._0_8_ = "is_not_mutated(block, false)";
    local_510.m_message.px = (element_type *)0xc8bab6;
    local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
    local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
    asStack_1e8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_4a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_4a0 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    asStack_1e8[1].pi_ = (sp_counted_base *)&local_510;
    local_530.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar9.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_530,(lazy_ostream *)local_1f8,1,0,WARN,_cVar15,(size_t)&local_4a8,0x129);
    boost::detail::shared_count::~shared_count(&local_530.m_message.pn);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::clear(pvVar1);
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_1f8);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)pvVar1,(shared_ptr<const_CTransaction> *)local_1f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
    local_4b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_4b0 = "";
    local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x130;
    file_13.m_begin = (iterator)&local_4b8;
    msg_13.m_end = pvVar14;
    msg_13.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4c8,
               msg_13);
    bVar8 = CTransaction::IsCoinBase
                      (block.vtx.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_530.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar8;
    local_530.m_message.px = (element_type *)0x0;
    local_530.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_510._0_8_ = "!block.vtx.back()->IsCoinBase()";
    local_510.m_message.px = (element_type *)0xc8bd7b;
    local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
    local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
    asStack_1e8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_4d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_4d0 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    asStack_1e8[1].pi_ = (sp_counted_base *)&local_510;
    boost::test_tools::tt_detail::report_assertion
              (&local_530,(lazy_ostream *)local_1f8,1,0,WARN,_cVar15,(size_t)&local_4d8,0x130);
    boost::detail::shared_count::~shared_count(&local_530.m_message.pn);
    local_4e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_4e0 = "";
    local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x131;
    file_14.m_begin = (iterator)&local_4e8;
    msg_14.m_end = pvVar14;
    msg_14.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4f8,
               msg_14);
    BlockMerkleRoot((uint256 *)local_1f8,&block,(bool *)0x0);
    rVar10.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         ::operator==((base_blob<256U> *)local_1f8,&merkle_root.super_base_blob<256U>);
    local_510.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar10.super_readonly_property<bool>.super_class_property<bool>.value;
    local_510.m_message.px = (element_type *)0x0;
    local_510.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_518 = &local_540;
    local_540 = "BlockMerkleRoot(block) == merkle_root";
    local_538 = "";
    local_530.m_message.px = (element_type *)((ulong)local_530.m_message.px & 0xffffffffffffff00);
    local_530._0_8_ = &PTR__lazy_ostream_011481f0;
    local_530.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_550 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_548 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_510,(lazy_ostream *)&local_530,1,0,WARN,_cVar15,(size_t)&local_550,0x131);
    boost::detail::shared_count::~shared_count(&local_510.m_message.pn);
    local_560 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_558 = "";
    local_570 = &boost::unit_test::basic_cstring<char_const>::null;
    local_568 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = (iterator)0x132;
    file_15.m_begin = (iterator)&local_560;
    msg_15.m_end = pvVar14;
    msg_15.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_570,
               msg_15);
    rVar10.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         test_method::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)&block,(CBlock *)0x0,check_witness_root_03);
    local_530.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar10.super_readonly_property<bool>.super_class_property<bool>.value;
    local_530.m_message.px = (element_type *)0x0;
    local_530.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_510._0_8_ = "is_mutated(block, false)";
    local_510.m_message.px = (element_type *)0xc8ba99;
    local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
    local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
    asStack_1e8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_580 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_578 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    asStack_1e8[1].pi_ = (sp_counted_base *)&local_510;
    boost::test_tools::tt_detail::report_assertion
              (&local_530,(lazy_ostream *)local_1f8,1,0,WARN,_cVar15,(size_t)&local_580,0x132);
    boost::detail::shared_count::~shared_count(&local_530.m_message.pn);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(pvVar1);
    CMutableTransaction::~CMutableTransaction(&tx3);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&hasher_1);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&hasher);
    CBlock::CBlock(&block);
    test_method::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&hasher,true);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)&block.vtx,(shared_ptr<const_CTransaction> *)&hasher);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(hasher.ctx.s + 2));
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&hasher);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hasher,1);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)(hasher.ctx.s._0_8_ + 0x50),1);
    hasher_1.ctx.s._0_8_ = hasher_1.ctx.s._0_8_ & 0xffffffffffffff00;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              (*(vector<unsigned_char,std::allocator<unsigned_char>> **)(hasher.ctx.s._0_8_ + 0x50),
               &hasher_1);
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&hasher_1);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)&block.vtx,(shared_ptr<const_CTransaction> *)&hasher_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(hasher_1.ctx.s + 2));
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&hasher);
    BlockMerkleRoot((uint256 *)&hasher,&block,(bool *)0x0);
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
         (uchar)hasher.ctx.s[4];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._17_7_ =
         hasher.ctx.s._17_7_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
         hasher.ctx.s._24_8_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] =
         (uchar)hasher.ctx.s[0];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._1_7_ =
         hasher.ctx.s._1_7_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] =
         (uchar)hasher.ctx.s[2];
    local_590 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_588 = "";
    local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_598 = &boost::unit_test::basic_cstring<char_const>::null;
    file_16.m_end = (iterator)0x142;
    file_16.m_begin = (iterator)&local_590;
    msg_16.m_end = pvVar14;
    msg_16.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_5a0,
               msg_16);
    bVar8 = test_method::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&block,(CBlock *)0x0,check_witness_root_04);
    hasher_1.ctx.s[2] = 0;
    hasher_1.ctx.s[3] = 0;
    hasher_1.ctx.s[4] = 0;
    hasher_1.ctx.s[5] = 0;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_156857e;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xc8ba99;
    hasher.ctx.s[2]._0_1_ = 0;
    hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
    hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_5b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_5a8 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    hasher.ctx.s._24_8_ = &tx3;
    hasher_1.ctx.s[0]._0_1_ = bVar8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar15,
               (size_t)&local_5b0,0x142);
    boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
    local_5c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_5b8 = "";
    local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_17.m_end = (iterator)0x144;
    file_17.m_begin = (iterator)&local_5c0;
    msg_17.m_end = pvVar14;
    msg_17.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_5d0,
               msg_17);
    hasher_1.ctx.s[0]._0_1_ =
         test_method::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)&block,(CBlock *)&DAT_00000001,check_witness_root_05)
    ;
    hasher_1.ctx.s[2] = 0;
    hasher_1.ctx.s[3] = 0;
    hasher_1.ctx.s[4] = 0;
    hasher_1.ctx.s[5] = 0;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_15686ee;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xc8bdb9;
    hasher.ctx.s[2]._0_1_ = 0;
    hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
    hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_5e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_5d8 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    hasher.ctx.s._24_8_ = &tx3;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar15,
               (size_t)&local_5e0,0x144);
    boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
    pCVar12 = &block;
    BlockWitnessMerkleRoot((uint256 *)&hasher,pCVar12,(bool *)0x0);
    _cVar16 = CONCAT71(hasher.ctx.s._9_7_,(uchar)hasher.ctx.s[2]);
    commitment.super_base_blob<256U>.m_data._M_elems[8] = (uchar)hasher.ctx.s[2];
    commitment.super_base_blob<256U>.m_data._M_elems[9] = hasher.ctx.s[2]._1_1_;
    commitment.super_base_blob<256U>.m_data._M_elems[10] = hasher.ctx.s[2]._2_1_;
    commitment.super_base_blob<256U>.m_data._M_elems[0xb] = hasher.ctx.s[2]._3_1_;
    commitment.super_base_blob<256U>.m_data._M_elems._0_8_ = hasher.ctx.s._0_8_;
    commitment.super_base_blob<256U>.m_data._M_elems._16_8_ = hasher.ctx.s._16_8_;
    commitment.super_base_blob<256U>.m_data._M_elems._24_8_ = hasher.ctx.s._24_8_;
    test_method::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&block,pCVar12,commitment);
    BlockMerkleRoot((uint256 *)&hasher_1,&block,(bool *)0x0);
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
         (uchar)hasher_1.ctx.s[4];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._17_7_ =
         hasher_1.ctx.s._17_7_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
         hasher_1.ctx.s._24_8_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] =
         (uchar)hasher_1.ctx.s[0];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._1_7_ =
         hasher_1.ctx.s._1_7_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] =
         (uchar)hasher_1.ctx.s[2];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._9_7_ =
         hasher_1.ctx.s._9_7_;
    local_5f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_5e8 = "";
    local_600 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_18.m_end = (iterator)0x14c;
    file_18.m_begin = (iterator)&local_5f0;
    msg_18.m_end = pvVar14;
    msg_18.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_600,
               msg_18);
    hasher_1.ctx.s[0]._0_1_ =
         test_method::anon_class_8_1_4b23ed87::operator()(&is_not_mutated,&block,true);
    hasher_1.ctx.s[2] = 0;
    hasher_1.ctx.s[3] = 0;
    hasher_1.ctx.s[4] = 0;
    hasher_1.ctx.s[5] = 0;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_15686fa;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xc8bdd5;
    hasher.ctx.s[2]._0_1_ = 0;
    hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
    hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_610 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_608 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    hasher.ctx.s._24_8_ = &tx3;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar16,
               (size_t)&local_610,0x14c);
    boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)&hasher,
               block.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pcVar4 = (char *)**(undefined8 **)(hasher.ctx.s._0_8_ + 0x50);
    if (pcVar4 == (char *)(*(undefined8 **)(hasher.ctx.s._0_8_ + 0x50))[1]) {
      __assert_fail("!mtx.vin[0].scriptWitness.stack[0].empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
                    ,0x151,"void validation_tests::block_malleation::test_method()");
    }
    *pcVar4 = *pcVar4 + '\x01';
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&hasher_1);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&block.vtx.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1].
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&hasher_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(hasher_1.ctx.s + 2));
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&hasher);
    local_620 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_618 = "";
    local_630 = &boost::unit_test::basic_cstring<char_const>::null;
    local_628 = &boost::unit_test::basic_cstring<char_const>::null;
    file_19.m_end = (iterator)0x157;
    file_19.m_begin = (iterator)&local_620;
    msg_19.m_end = pvVar14;
    msg_19.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_630,
               msg_19);
    BlockMerkleRoot((uint256 *)&hasher,&block,(bool *)0x0);
    bVar8 = ::operator==(&block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>,
                         (base_blob<256U> *)&hasher);
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_start._1_7_,bVar8);
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    merkle_root.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1568720;
    merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"block.hashMerkleRoot == BlockMerkleRoot(block)" + 0x2e;
    hasher_1.ctx.s._8_8_ = hasher_1.ctx.s._8_8_ & 0xffffffffffffff00;
    hasher_1.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
    hasher_1.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    hasher_1.ctx.s._24_8_ = &merkle_root;
    local_640 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_638 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&tx3,(lazy_ostream *)&hasher_1,1,0,WARN,_cVar16,
               (size_t)&local_640,0x157);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_650 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_648 = "";
    local_660 = &boost::unit_test::basic_cstring<char_const>::null;
    local_658 = &boost::unit_test::basic_cstring<char_const>::null;
    file_20.m_end = (iterator)0x158;
    file_20.m_begin = (iterator)&local_650;
    msg_20.m_end = pvVar14;
    msg_20.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_660,
               msg_20);
    bVar8 = test_method::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&block,(CBlock *)&DAT_00000001,
                       check_witness_root_06);
    hasher_1.ctx.s[2] = 0;
    hasher_1.ctx.s[3] = 0;
    hasher_1.ctx.s[4] = 0;
    hasher_1.ctx.s[5] = 0;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_15686ee;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xc8bdb9;
    hasher.ctx.s[2]._0_1_ = 0;
    hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
    hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_670 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_668 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    hasher.ctx.s._24_8_ = &tx3;
    hasher_1.ctx.s[0]._0_1_ = bVar8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar16,
               (size_t)&local_670,0x158);
    boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
    pCVar12 = &block;
    BlockWitnessMerkleRoot((uint256 *)&hasher,pCVar12,(bool *)0x0);
    _cVar16 = CONCAT71(hasher.ctx.s._9_7_,(uchar)hasher.ctx.s[2]);
    commitment_00.super_base_blob<256U>.m_data._M_elems[8] = (uchar)hasher.ctx.s[2];
    commitment_00.super_base_blob<256U>.m_data._M_elems[9] = hasher.ctx.s[2]._1_1_;
    commitment_00.super_base_blob<256U>.m_data._M_elems[10] = hasher.ctx.s[2]._2_1_;
    commitment_00.super_base_blob<256U>.m_data._M_elems[0xb] = hasher.ctx.s[2]._3_1_;
    commitment_00.super_base_blob<256U>.m_data._M_elems._0_8_ = hasher.ctx.s._0_8_;
    commitment_00.super_base_blob<256U>.m_data._M_elems._16_8_ = hasher.ctx.s._16_8_;
    commitment_00.super_base_blob<256U>.m_data._M_elems._24_8_ = hasher.ctx.s._24_8_;
    test_method::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&block,pCVar12,commitment_00);
    BlockMerkleRoot((uint256 *)&hasher_1,&block,(bool *)0x0);
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
         (uchar)hasher_1.ctx.s[4];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._17_7_ =
         hasher_1.ctx.s._17_7_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
         hasher_1.ctx.s._24_8_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] =
         (uchar)hasher_1.ctx.s[0];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._1_7_ =
         hasher_1.ctx.s._1_7_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] =
         (uchar)hasher_1.ctx.s[2];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._9_7_ =
         hasher_1.ctx.s._9_7_;
    local_680 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_678 = "";
    local_690 = &boost::unit_test::basic_cstring<char_const>::null;
    local_688 = &boost::unit_test::basic_cstring<char_const>::null;
    file_21.m_end = (iterator)0x15e;
    file_21.m_begin = (iterator)&local_680;
    msg_21.m_end = pvVar14;
    msg_21.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_690,
               msg_21);
    hasher_1.ctx.s[0]._0_1_ =
         test_method::anon_class_8_1_4b23ed87::operator()(&is_not_mutated,&block,true);
    hasher_1.ctx.s[2] = 0;
    hasher_1.ctx.s[3] = 0;
    hasher_1.ctx.s[4] = 0;
    hasher_1.ctx.s[5] = 0;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_15686fa;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xc8bdd5;
    hasher.ctx.s[2]._0_1_ = 0;
    hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
    hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_6a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_698 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    hasher.ctx.s._24_8_ = &tx3;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar16,
               (size_t)&local_6a0,0x15e);
    boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)&hasher,
               ((block.vtx.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)(hasher.ctx.s._0_8_ + 0x50),0);
    std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&hasher_1);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(block.vtx.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&hasher_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(hasher_1.ctx.s + 2));
    BlockMerkleRoot((uint256 *)&hasher_1,&block,(bool *)0x0);
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
         (uchar)hasher_1.ctx.s[4];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._17_7_ =
         hasher_1.ctx.s._17_7_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
         hasher_1.ctx.s._24_8_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] =
         (uchar)hasher_1.ctx.s[0];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._1_7_ =
         hasher_1.ctx.s._1_7_;
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] =
         (uchar)hasher_1.ctx.s[2];
    block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._9_7_ =
         hasher_1.ctx.s._9_7_;
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&hasher);
    local_6b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_6a8 = "";
    local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_22.m_end = (iterator)0x167;
    file_22.m_begin = (iterator)&local_6b0;
    msg_22.m_end = pvVar14;
    msg_22.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_6c0,
               msg_22);
    hasher_1.ctx.s[0]._0_1_ =
         test_method::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)&block,(CBlock *)&DAT_00000001,check_witness_root_07)
    ;
    hasher_1.ctx.s[2] = 0;
    hasher_1.ctx.s[3] = 0;
    hasher_1.ctx.s[4] = 0;
    hasher_1.ctx.s[5] = 0;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_15686ee;
    tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xc8bdb9;
    hasher.ctx.s[2]._0_1_ = 0;
    hasher.ctx.s._0_8_ = &PTR__lazy_ostream_011481f0;
    hasher.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_6d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_6c8 = "";
    hasher.ctx.s._24_8_ = &tx3;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&hasher_1,(lazy_ostream *)&hasher,1,0,WARN,_cVar16,
               (size_t)&local_6d0,0x167);
    boost::detail::shared_count::~shared_count((shared_count *)(hasher_1.ctx.s + 4));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&block.vtx);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("GetSerializeSize(TX_NO_WITNESS(tx3)) == 64",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_tests.cpp"
                ,0x122,"void validation_tests::block_malleation::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(block_malleation)
{
    // Test utilities that calls `IsBlockMutated` and then clears the validity
    // cache flags on `CBlock`.
    auto is_mutated = [](CBlock& block, bool check_witness_root) {
        bool mutated{IsBlockMutated(block, check_witness_root)};
        block.fChecked = false;
        block.m_checked_witness_commitment = false;
        block.m_checked_merkle_root = false;
        return mutated;
    };
    auto is_not_mutated = [&is_mutated](CBlock& block, bool check_witness_root) {
        return !is_mutated(block, check_witness_root);
    };

    // Test utilities to create coinbase transactions and insert witness
    // commitments.
    //
    // Note: this will not include the witness stack by default to avoid
    // triggering the "no witnesses allowed for blocks that don't commit to
    // witnesses" rule when testing other malleation vectors.
    auto create_coinbase_tx = [](bool include_witness = false) {
        CMutableTransaction coinbase;
        coinbase.vin.resize(1);
        if (include_witness) {
            coinbase.vin[0].scriptWitness.stack.resize(1);
            coinbase.vin[0].scriptWitness.stack[0] = std::vector<unsigned char>(32, 0x00);
        }

        coinbase.vout.resize(1);
        coinbase.vout[0].scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT);
        coinbase.vout[0].scriptPubKey[0] = OP_RETURN;
        coinbase.vout[0].scriptPubKey[1] = 0x24;
        coinbase.vout[0].scriptPubKey[2] = 0xaa;
        coinbase.vout[0].scriptPubKey[3] = 0x21;
        coinbase.vout[0].scriptPubKey[4] = 0xa9;
        coinbase.vout[0].scriptPubKey[5] = 0xed;

        auto tx = MakeTransactionRef(coinbase);
        assert(tx->IsCoinBase());
        return tx;
    };
    auto insert_witness_commitment = [](CBlock& block, uint256 commitment) {
        assert(!block.vtx.empty() && block.vtx[0]->IsCoinBase() && !block.vtx[0]->vout.empty());

        CMutableTransaction mtx{*block.vtx[0]};
        CHash256().Write(commitment).Write(std::vector<unsigned char>(32, 0x00)).Finalize(commitment);
        memcpy(&mtx.vout[0].scriptPubKey[6], commitment.begin(), 32);
        block.vtx[0] = MakeTransactionRef(mtx);
    };

    {
        CBlock block;

        // Empty block is expected to have merkle root of 0x0.
        BOOST_CHECK(block.vtx.empty());
        block.hashMerkleRoot = uint256{1};
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
        block.hashMerkleRoot = uint256{};
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/false));

        // Block with a single coinbase tx is mutated if the merkle root is not
        // equal to the coinbase tx's hash.
        block.vtx.push_back(create_coinbase_tx());
        BOOST_CHECK(block.vtx[0]->GetHash() != block.hashMerkleRoot);
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
        block.hashMerkleRoot = block.vtx[0]->GetHash();
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/false));

        // Block with two transactions is mutated if the merkle root does not
        // match the double sha256 of the concatenation of the two transaction
        // hashes.
        block.vtx.push_back(MakeTransactionRef(CMutableTransaction{}));
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
        HashWriter hasher;
        hasher.write(block.vtx[0]->GetHash());
        hasher.write(block.vtx[1]->GetHash());
        block.hashMerkleRoot = hasher.GetHash();
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/false));

        // Block with two transactions is mutated if any node is duplicate.
        {
            block.vtx[1] = block.vtx[0];
            HashWriter hasher;
            hasher.write(block.vtx[0]->GetHash());
            hasher.write(block.vtx[1]->GetHash());
            block.hashMerkleRoot = hasher.GetHash();
            BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
        }

        // Blocks with 64-byte coinbase transactions are not considered mutated
        block.vtx.clear();
        {
            CMutableTransaction mtx;
            mtx.vin.resize(1);
            mtx.vout.resize(1);
            mtx.vout[0].scriptPubKey.resize(4);
            block.vtx.push_back(MakeTransactionRef(mtx));
            block.hashMerkleRoot = block.vtx.back()->GetHash();
            assert(block.vtx.back()->IsCoinBase());
            assert(GetSerializeSize(TX_NO_WITNESS(block.vtx.back())) == 64);
        }
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/false));
    }

    {
        // Test merkle root malleation

        // Pseudo code to mine transactions tx{1,2,3}:
        //
        // ```
        // loop {
        //   tx1 = random_tx()
        //   tx2 = random_tx()
        //   tx3 = deserialize_tx(txid(tx1) || txid(tx2));
        //   if serialized_size_without_witness(tx3) == 64 {
        //     print(hex(tx3))
        //     break
        //   }
        // }
        // ```
        //
        // The `random_tx` function used to mine the txs below simply created
        // empty transactions with a random version field.
        CMutableTransaction tx1;
        BOOST_CHECK(DecodeHexTx(tx1, "ff204bd0000000000000", /*try_no_witness=*/true, /*try_witness=*/false));
        CMutableTransaction tx2;
        BOOST_CHECK(DecodeHexTx(tx2, "8ae53c92000000000000", /*try_no_witness=*/true, /*try_witness=*/false));
        CMutableTransaction tx3;
        BOOST_CHECK(DecodeHexTx(tx3, "cdaf22d00002c6a7f848f8ae4d30054e61dcf3303d6fe01d282163341f06feecc10032b3160fcab87bdfe3ecfb769206ef2d991b92f8a268e423a6ef4d485f06", /*try_no_witness=*/true, /*try_witness=*/false));
        {
            // Verify that double_sha256(txid1||txid2) == txid3
            HashWriter hasher;
            hasher.write(tx1.GetHash());
            hasher.write(tx2.GetHash());
            assert(hasher.GetHash() == tx3.GetHash());
            // Verify that tx3 is 64 bytes in size (without witness).
            assert(GetSerializeSize(TX_NO_WITNESS(tx3)) == 64);
        }

        CBlock block;
        block.vtx.push_back(MakeTransactionRef(tx1));
        block.vtx.push_back(MakeTransactionRef(tx2));
        uint256 merkle_root = block.hashMerkleRoot = BlockMerkleRoot(block);
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/false));

        // Mutate the block by replacing the two transactions with one 64-byte
        // transaction that serializes into the concatenation of the txids of
        // the transactions in the unmutated block.
        block.vtx.clear();
        block.vtx.push_back(MakeTransactionRef(tx3));
        BOOST_CHECK(!block.vtx.back()->IsCoinBase());
        BOOST_CHECK(BlockMerkleRoot(block) == merkle_root);
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
    }

    {
        CBlock block;
        block.vtx.push_back(create_coinbase_tx(/*include_witness=*/true));
        {
            CMutableTransaction mtx;
            mtx.vin.resize(1);
            mtx.vin[0].scriptWitness.stack.resize(1);
            mtx.vin[0].scriptWitness.stack[0] = {0};
            block.vtx.push_back(MakeTransactionRef(mtx));
        }
        block.hashMerkleRoot = BlockMerkleRoot(block);
        // Block with witnesses is considered mutated if the witness commitment
        // is not validated.
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/false));
        // Block with invalid witness commitment is considered mutated.
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/true));

        // Block with valid commitment is not mutated
        {
            auto commitment{BlockWitnessMerkleRoot(block)};
            insert_witness_commitment(block, commitment);
            block.hashMerkleRoot = BlockMerkleRoot(block);
        }
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/true));

        // Malleating witnesses should be caught by `IsBlockMutated`.
        {
            CMutableTransaction mtx{*block.vtx[1]};
            assert(!mtx.vin[0].scriptWitness.stack[0].empty());
            ++mtx.vin[0].scriptWitness.stack[0][0];
            block.vtx[1] = MakeTransactionRef(mtx);
        }
        // Without also updating the witness commitment, the merkle root should
        // not change when changing one of the witnesses.
        BOOST_CHECK(block.hashMerkleRoot == BlockMerkleRoot(block));
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/true));
        {
            auto commitment{BlockWitnessMerkleRoot(block)};
            insert_witness_commitment(block, commitment);
            block.hashMerkleRoot = BlockMerkleRoot(block);
        }
        BOOST_CHECK(is_not_mutated(block, /*check_witness_root=*/true));

        // Test malleating the coinbase witness reserved value
        {
            CMutableTransaction mtx{*block.vtx[0]};
            mtx.vin[0].scriptWitness.stack.resize(0);
            block.vtx[0] = MakeTransactionRef(mtx);
            block.hashMerkleRoot = BlockMerkleRoot(block);
        }
        BOOST_CHECK(is_mutated(block, /*check_witness_root=*/true));
    }
}